

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib540.c
# Opt level: O0

int test(char *URL)

{
  undefined8 uVar1;
  int iVar2;
  curl_slist *headers_00;
  undefined8 uVar3;
  CURLM *cm_00;
  timeval tVar4;
  __time_t _Stack_140;
  CURLcode ec;
  __suseconds_t local_138;
  int local_130;
  int local_12c;
  int i;
  int res;
  char buffer [246];
  curl_slist *headers;
  CURLM *cm;
  char *URL_local;
  
  local_12c = 0;
  for (local_130 = 0; local_130 < 2; local_130 = local_130 + 1) {
    eh[local_130] = (CURL *)0x0;
  }
  tVar4 = tutil_tvnow();
  _Stack_140 = tVar4.tv_sec;
  tv_test_start.tv_sec = _Stack_140;
  local_138 = tVar4.tv_usec;
  tv_test_start.tv_usec = local_138;
  if (test_argc < 4) {
    URL_local._4_4_ = 99;
  }
  else {
    curl_msnprintf(&i,0xf6,"Host: %s",test_argv[4]);
    headers_00 = (curl_slist *)curl_slist_append(0,&i);
    if (headers_00 == (curl_slist *)0x0) {
      curl_mfprintf(_stderr,"curl_slist_append() failed\n");
      URL_local._4_4_ = 0x7e;
    }
    else {
      iVar2 = curl_global_init();
      uVar1 = _stderr;
      if (iVar2 != 0) {
        uVar3 = curl_easy_strerror(iVar2);
        curl_mfprintf(uVar1,"%s:%d curl_global_init() failed, with code %d (%s)\n",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/devkitPro[P]curl/tests/libtest/lib540.c"
                      ,0xd2,iVar2,uVar3);
        local_12c = iVar2;
      }
      if (local_12c == 0) {
        cm_00 = (CURLM *)curl_multi_init();
        if (cm_00 == (CURLM *)0x0) {
          curl_mfprintf(_stderr,"%s:%d curl_multi_init() failed\n",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/devkitPro[P]curl/tests/libtest/lib540.c"
                        ,0xd8);
          local_12c = 0x7b;
        }
        if (local_12c == 0) {
          local_12c = loop(0,cm_00,URL,libtest_arg3,headers_00);
          if (local_12c == 0) {
            curl_mfprintf(_stderr,"lib540: now we do the request again\n");
            local_12c = loop(1,cm_00,URL,libtest_arg3,headers_00);
          }
          for (local_130 = 0; local_130 < 2; local_130 = local_130 + 1) {
            curl_multi_remove_handle(cm_00,eh[local_130]);
            curl_easy_cleanup(eh[local_130]);
          }
          curl_multi_cleanup(cm_00);
          curl_global_cleanup();
          curl_slist_free_all(headers_00);
          URL_local._4_4_ = local_12c;
        }
        else {
          curl_global_cleanup();
          curl_slist_free_all(headers_00);
          URL_local._4_4_ = local_12c;
        }
      }
      else {
        curl_slist_free_all(headers_00);
        URL_local._4_4_ = local_12c;
      }
    }
  }
  return URL_local._4_4_;
}

Assistant:

int test(char *URL)
{
  CURLM *cm = NULL;
  struct curl_slist *headers = NULL;
  char buffer[246]; /* naively fixed-size */
  int res = 0;
  int i;

  for(i = 0; i < NUM_HANDLES; i++)
    eh[i] = NULL;

  start_test_timing();

  if(test_argc < 4)
    return 99;

  msnprintf(buffer, sizeof(buffer), "Host: %s", HOST);

  /* now add a custom Host: header */
  headers = curl_slist_append(headers, buffer);
  if(!headers) {
    fprintf(stderr, "curl_slist_append() failed\n");
    return TEST_ERR_MAJOR_BAD;
  }

  res_global_init(CURL_GLOBAL_ALL);
  if(res) {
    curl_slist_free_all(headers);
    return res;
  }

  res_multi_init(cm);
  if(res) {
    curl_global_cleanup();
    curl_slist_free_all(headers);
    return res;
  }

  res = loop(0, cm, URL, PROXYUSERPWD, headers);
  if(res)
    goto test_cleanup;

  fprintf(stderr, "lib540: now we do the request again\n");

  res = loop(1, cm, URL, PROXYUSERPWD, headers);

test_cleanup:

  /* proper cleanup sequence - type PB */

  for(i = 0; i < NUM_HANDLES; i++) {
    curl_multi_remove_handle(cm, eh[i]);
    curl_easy_cleanup(eh[i]);
  }

  curl_multi_cleanup(cm);
  curl_global_cleanup();

  curl_slist_free_all(headers);

  return res;
}